

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Coxeter_triangulation.h
# Opt level: O0

Matrix * __thiscall
Gudhi::coxeter_triangulation::
Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
::root_matrix(Matrix *__return_storage_ptr__,
             Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             *this,uint d)

{
  Scalar *pSVar1;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *this_00;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  double dVar4;
  Nested local_158;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_150;
  Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1>
  local_140;
  Inverse<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1>_>
  local_128;
  undefined1 local_109;
  MatrixTypeNested local_108;
  ConstantReturnType local_100;
  undefined1 local_e8 [8];
  Matrix lower;
  undefined1 local_c8 [4];
  uint i_1;
  VectorXd sqrt_diag;
  SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> saes;
  uint local_54;
  undefined1 local_50 [4];
  uint i;
  undefined1 local_38 [8];
  Matrix cartan;
  uint d_local;
  Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *this_local;
  Matrix *result;
  
  cartan.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ = d
  ;
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            ((IdentityReturnType *)local_50,(ulong)d,(ulong)d);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_38,
             (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)local_50);
  for (local_54 = 1;
      local_54 <
      cartan.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_
      ; local_54 = local_54 + 1) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_38,
                        (ulong)(local_54 - 1),(ulong)local_54);
    *pSVar1 = -0.5;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_38,
                        (ulong)local_54,(ulong)(local_54 - 1));
    *pSVar1 = -0.5;
  }
  Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
             &sqrt_diag.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38,0x80);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_c8,
             (uint *)((long)&cartan.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                             .m_storage.m_cols + 4));
  for (lower.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_
            = 0;
      lower.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_
      < cartan.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
        _4_4_; lower.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols._4_4_ = lower.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              .m_storage.m_cols._4_4_ + 1) {
    this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
              Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvalues
                        ((SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         &sqrt_diag.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows);
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       (this_00,(ulong)lower.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                       .m_storage.m_cols._4_4_);
    dVar4 = sqrt(*pdVar2);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_c8,
                        (ulong)lower.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_cols._4_4_);
    *pSVar3 = dVar4;
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Ones
            (&local_100,
             (ulong)cartan.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols._4_4_,
             (ulong)cartan.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols._4_4_);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_e8,&local_100);
  local_108 = (MatrixTypeNested)
              Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::triangularView<1u>
                        ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_e8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)local_e8,
             (EigenBase<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_> *)
             &local_108);
  local_109 = 0;
  other = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
          Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvectors
                    ((SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     &sqrt_diag.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows);
  local_150 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_e8,other);
  local_158 = (Nested)Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::asDiagonal
                                ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_c8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
  ::operator*(&local_140,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
               *)&local_150,
              (DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)&local_158);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_1>_>
  ::inverse(&local_128,
            (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1>_>
             *)&local_140);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Inverse<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::DiagonalWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>,1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::Inverse<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1>_>_>
              *)&local_128);
  local_109 = 1;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_e8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_c8);
  Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~SelfAdjointEigenSolver
            ((SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             &sqrt_diag.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Matrix root_matrix(unsigned d) {
    Matrix cartan(Matrix::Identity(d, d));
    for (unsigned i = 1; i < d; i++) {
      cartan(i - 1, i) = -0.5;
      cartan(i, i - 1) = -0.5;
    }
    Eigen::SelfAdjointEigenSolver<Matrix> saes(cartan);
    Eigen::VectorXd sqrt_diag(d);
    for (unsigned i = 0; i < d; ++i) sqrt_diag(i) = std::sqrt(saes.eigenvalues()[i]);

    Matrix lower(Matrix::Ones(d, d));
    lower = lower.triangularView<Eigen::Lower>();

    Matrix result = (lower * saes.eigenvectors() * sqrt_diag.asDiagonal()).inverse();
    return result;
  }